

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

char __thiscall capnp::anon_unknown_79::Input::nextChar(Input *this)

{
  bool bVar1;
  char *pcVar2;
  Fault local_20;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Input *this_local;
  
  bVar1 = exhausted(this);
  f.exception._6_1_ = (bVar1 ^ 0xffU) & 1;
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x22c,FAILED,"!exhausted()","_kjCondition,\"JSON message ends prematurely.\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [31])"JSON message ends prematurely.");
    kj::_::Debug::Fault::fatal(&local_20);
  }
  pcVar2 = kj::ArrayPtr<const_char>::front(&this->wrapped);
  return *pcVar2;
}

Assistant:

char nextChar() {
    KJ_REQUIRE(!exhausted(), "JSON message ends prematurely.");
    return wrapped.front();
  }